

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O1

void duckdb_je_sc_data_init(sc_data_t *sc_data)

{
  _Bool _Var1;
  int index;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  sc_t *psVar8;
  ulong uVar9;
  int lg_ngroup;
  undefined8 in_R9;
  int iVar10;
  int iVar11;
  int lg_base;
  int iVar12;
  ulong uVar13;
  size_t sVar14;
  long lVar15;
  int in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  long lVar16;
  
  sc_data->sc[0].index = 0;
  sc_data->sc[0].lg_base = 3;
  sc_data->sc[0].lg_delta = 3;
  sc_data->sc[0].ndelta = 0;
  sc_data->sc[0].psz = false;
  sc_data->sc[0].bin = true;
  sc_data->sc[0].pgs = 1;
  sc_data->sc[0].lg_delta_lookup = 3;
  sc_data->sc[1].index = 1;
  sc_data->sc[1].lg_base = 3;
  sc_data->sc[1].lg_delta = 3;
  sc_data->sc[1].ndelta = 1;
  sc_data->sc[1].psz = false;
  sc_data->sc[1].bin = true;
  sc_data->sc[1].pgs = 1;
  sc_data->sc[1].lg_delta_lookup = 3;
  psVar8 = sc_data->sc + 2;
  uVar7 = 0;
  lg_base = 2;
  lVar5 = -3;
  do {
    size_class(psVar8,(int)lVar5 + 5,4,4,(int)lVar5 + 4,(int)in_R9,in_stack_ffffffffffffff68,
               (int)in_stack_ffffffffffffff70);
    uVar7 = uVar7 + psVar8->psz;
    lg_base = lg_base + (uint)psVar8->bin;
    psVar8 = psVar8 + 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  iVar10 = 0;
  lVar4 = 5;
  iVar11 = 1;
  lg_ngroup = 4;
  sVar14 = 0;
  sVar6 = 0;
  lVar5 = 6;
  do {
    uVar13 = 1;
    lVar16 = lVar5 + 1;
    iVar12 = (int)lVar4;
    uVar9 = (ulong)(lVar5 == 0x3e) ^ 5;
    lVar15 = (lVar4 << 0x20) + -0x100000000;
    psVar8 = sc_data->sc + iVar12;
    do {
      index = (int)uVar13;
      size_class(psVar8,iVar12 + -1 + index,(int)lVar5,lg_ngroup,index,lg_base,
                 in_stack_ffffffffffffff68,(int)lVar16);
      sVar2 = (uVar13 << ((byte)lg_ngroup & 0x3f)) + (1L << ((byte)lVar5 & 0x3f));
      if (psVar8->lg_delta_lookup != 0) {
        iVar11 = iVar12 + index;
        sVar6 = sVar2;
      }
      uVar7 = uVar7 + psVar8->psz;
      _Var1 = psVar8->bin;
      if (_Var1 != false) {
        sVar14 = sVar2;
      }
      if (_Var1 != false) {
        iVar10 = (int)lVar16;
      }
      lg_base = lg_base + (uint)_Var1;
      uVar13 = uVar13 + 1;
      lVar15 = lVar15 + 0x100000000;
      psVar8 = psVar8 + 1;
    } while (uVar9 != uVar13);
    lg_ngroup = lg_ngroup + 1;
    lVar4 = (long)iVar12 + uVar13 + -1;
    lVar5 = lVar16;
  } while (lVar16 != 0x3f);
  uVar13 = lVar15 >> 0x20;
  if (uVar13 == 0) {
    uVar3 = 0x40;
  }
  else {
    lVar5 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    uVar3 = (uint)lVar5 ^ 0x3f;
  }
  sc_data->ntiny = 1;
  sc_data->nlbins = iVar11;
  sc_data->nbins = lg_base;
  sc_data->nsizes = (int)uVar9 + iVar12 + -1;
  sc_data->lg_ceil_nsizes = 0x40 - uVar3;
  sc_data->npsizes = uVar7;
  sc_data->lg_tiny_maxclass = 3;
  sc_data->lookup_maxclass = sVar6;
  sc_data->small_maxclass = sVar14;
  sc_data->lg_large_minclass = iVar10;
  sc_data->large_minclass = 1L << ((byte)iVar10 & 0x3f);
  sc_data->large_maxclass = sVar2;
  sc_data->initialized = true;
  return;
}

Assistant:

void
sc_data_init(sc_data_t *sc_data) {
	size_classes(sc_data, LG_SIZEOF_PTR, LG_QUANTUM, SC_LG_TINY_MIN,
	    SC_LG_MAX_LOOKUP, LG_PAGE, SC_LG_NGROUP);

	sc_data->initialized = true;
}